

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O2

void __thiscall NaPNDelay::add_delay(NaPNDelay *this,uint iShift)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint *puVar4;
  undefined4 *puVar5;
  ulong uVar6;
  uint uVar7;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  puVar4 = this->piOutMap;
  if ((puVar4 != (uint *)0x0) && (uVar7 = this->nOutDim, uVar7 != 0)) {
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      puVar1 = puVar4 + uVar6;
      *puVar1 = *puVar1 + iShift;
      uVar7 = this->nOutDim;
    }
    uVar2 = this->nMaxLag;
    uVar3 = this->nMinLag;
    this->nMaxLag = iShift + uVar2;
    this->nMinLag = iShift + uVar3;
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&NaException::typeinfo,0);
}

Assistant:

void
NaPNDelay::add_delay (unsigned iShift)
{
    check_tunable();

    if(NULL == piOutMap || 0 == nOutDim)
      throw(na_null_pointer);

    unsigned	i;
    for(i = 0; i < nOutDim; ++i)
      piOutMap[i] += iShift;
    nMaxLag += iShift;
    nMinLag += iShift;
}